

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

VkStencilOpState * __thiscall
vkt::pipeline::anon_unknown_0::StencilOpStateUniqueRandomIterator::getIndexedValue
          (VkStencilOpState *__return_storage_ptr__,StencilOpStateUniqueRandomIterator *this,
          deUint32 index)

{
  __return_storage_ptr__->failOp =
       *(VkStencilOp *)(vkt::image::(anonymous_namespace)::s_imageTypes + (ulong)(index & 7) * 4);
  __return_storage_ptr__->passOp =
       *(VkStencilOp *)
        (vkt::image::(anonymous_namespace)::s_imageTypes +
        (ulong)((index & 0x1ff) - (index & 0x1c0) >> 3) * 4);
  __return_storage_ptr__->depthFailOp =
       *(VkStencilOp *)(vkt::image::(anonymous_namespace)::s_imageTypes + (index >> 4 & 0x1c));
  __return_storage_ptr__->compareOp =
       *(VkCompareOp *)(vkt::image::(anonymous_namespace)::s_imageTypes + (ulong)(index >> 9) * 4);
  __return_storage_ptr__->compareMask = 0;
  __return_storage_ptr__->writeMask = 0;
  __return_storage_ptr__->reference = 0;
  return __return_storage_ptr__;
}

Assistant:

VkStencilOpState StencilOpStateUniqueRandomIterator::getIndexedValue (deUint32 index)
{
	const deUint32 stencilCompareOpIndex = index / m_stencilOpsLength3;
	const deUint32 stencilCompareOpSeqIndex = stencilCompareOpIndex * m_stencilOpsLength3;

	const deUint32 stencilDepthFailOpIndex = (index - stencilCompareOpSeqIndex) / m_stencilOpsLength2;
	const deUint32 stencilDepthFailOpSeqIndex = stencilDepthFailOpIndex * m_stencilOpsLength2;

	const deUint32 stencilPassOpIndex = (index - stencilCompareOpSeqIndex - stencilDepthFailOpSeqIndex) / m_stencilOpsLength;
	const deUint32 stencilPassOpSeqIndex = stencilPassOpIndex * m_stencilOpsLength;

	const deUint32 stencilFailOpIndex = index - stencilCompareOpSeqIndex - stencilDepthFailOpSeqIndex - stencilPassOpSeqIndex;

	const VkStencilOpState stencilOpState =
	{
		m_stencilOps[stencilFailOpIndex],		// VkStencilOp	failOp;
		m_stencilOps[stencilPassOpIndex],		// VkStencilOp	passOp;
		m_stencilOps[stencilDepthFailOpIndex],	// VkStencilOp	depthFailOp;
		m_compareOps[stencilCompareOpIndex],	// VkCompareOp	compareOp;
		0x0,									// deUint32		compareMask;
		0x0,									// deUint32		writeMask;
		0x0										// deUint32		reference;
	};

	return stencilOpState;
}